

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Locale.cpp
# Opt level: O2

json loadLocaleData(string *fn)

{
  bool bVar1;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value jVar2;
  json *localeData;
  string *in_RSI;
  json jVar3;
  char *bytes;
  int count;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  bytes = (char *)0x0;
  count = 0;
  bVar1 = f8n::env::FileToByteArray(in_RSI,&bytes,&count,true);
  if (bVar1) {
    local_28 = 0;
    uStack_20 = 0;
    local_38._M_unused._M_object = (void *)0x0;
    local_38._8_8_ = 0;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::parse<char*&>((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     *)fn,&bytes,(parser_callback_t *)&local_38,true,false);
    std::_Function_base::~_Function_base((_Function_base *)&local_38);
    free(bytes);
    jVar2 = extraout_RDX;
  }
  else {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)fn,(nullptr_t)0x0);
    jVar2 = extraout_RDX_00;
  }
  jVar3.m_value.object = jVar2.object;
  jVar3._0_8_ = fn;
  return jVar3;
}

Assistant:

static nlohmann::json loadLocaleData(const std::string& fn) {
    char* bytes = nullptr;
    int count = 0;

    if (FileToByteArray(fn, &bytes, count, true) == true) {
        try {
            nlohmann::json localeData = nlohmann::json::parse(bytes);
            free(bytes);
            return localeData;
        }
        catch (...) {
        }

        free(bytes);
    }

    return nlohmann::json();
}